

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O2

void assessQpPrimalFeasibility
               (Instance *instance,double primal_feasibility_tolerance,
               vector<double,_std::allocator<double>_> *var_value,
               vector<double,_std::allocator<double>_> *con_value,HighsInt *num_var_infeasibilities,
               double *max_var_infeasibility,double *sum_var_infeasibilities,
               HighsInt *num_con_infeasibilities,double *max_con_infeasibility,
               double *sum_con_infeasibilities,double *max_con_residual,double *sum_con_residuals)

{
  int *piVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  _Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_> local_68;
  value_type local_48;
  
  *num_var_infeasibilities = 0;
  *max_var_infeasibility = 0.0;
  *sum_var_infeasibilities = 0.0;
  *num_con_infeasibilities = 0;
  *max_con_infeasibility = 0.0;
  *sum_con_infeasibilities = 0.0;
  *max_con_residual = 0.0;
  *sum_con_residuals = 0.0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.hi = 0.0;
  local_48.lo = 0.0;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)&local_68,
             (long)instance->num_con,&local_48);
  lVar8 = 0;
  while (lVar8 < instance->num_var) {
    dVar9 = (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    dVar11 = (var_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar8];
    if (dVar9 - primal_feasibility_tolerance <= dVar11) {
      dVar9 = (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if (dVar9 + primal_feasibility_tolerance < dVar11) {
        dVar9 = dVar11 - dVar9;
        goto LAB_0031ffac;
      }
    }
    else {
      dVar9 = dVar9 - dVar11;
LAB_0031ffac:
      if (0.0 < dVar9) {
        if (primal_feasibility_tolerance < dVar9) {
          *num_var_infeasibilities = *num_var_infeasibilities + 1;
        }
        dVar10 = *max_var_infeasibility;
        if (*max_var_infeasibility <= dVar9) {
          dVar10 = dVar9;
        }
        *max_var_infeasibility = dVar10;
        *sum_var_infeasibilities = dVar9 + *sum_var_infeasibilities;
      }
    }
    piVar5 = (instance->A).mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = piVar5 + lVar8;
    lVar8 = lVar8 + 1;
    for (lVar7 = (long)*piVar1; lVar7 < piVar5[lVar8]; lVar7 = lVar7 + 1) {
      HighsCDouble::operator+=
                (local_68._M_impl.super__Vector_impl_data._M_start +
                 (instance->A).mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7],
                 (instance->A).mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar7] * dVar11);
      piVar5 = (instance->A).mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  pdVar2 = (instance->con_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (instance->con_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (con_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = &(local_68._M_impl.super__Vector_impl_data._M_start)->lo;
  lVar8 = 0;
  do {
    if (instance->num_con <= lVar8) {
      std::_Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>::~_Vector_base(&local_68);
      return;
    }
    dVar9 = pdVar2[lVar8];
    dVar11 = pdVar4[lVar8];
    if (dVar9 - primal_feasibility_tolerance <= dVar11) {
      dVar9 = pdVar3[lVar8];
      if (dVar9 + primal_feasibility_tolerance < dVar11) {
        dVar9 = dVar11 - dVar9;
        goto LAB_003200da;
      }
    }
    else {
      dVar9 = dVar9 - dVar11;
LAB_003200da:
      if (0.0 < dVar9) {
        if (primal_feasibility_tolerance < dVar9) {
          *num_con_infeasibilities = *num_con_infeasibilities + 1;
        }
        dVar10 = *max_con_infeasibility;
        if (*max_con_infeasibility <= dVar9) {
          dVar10 = dVar9;
        }
        *max_con_infeasibility = dVar10;
        *sum_con_infeasibilities = dVar9 + *sum_con_infeasibilities;
      }
    }
    dVar11 = ABS(dVar11 - (((HighsCDouble *)(pdVar6 + -1))->hi + *pdVar6));
    dVar9 = *max_con_residual;
    if (*max_con_residual <= dVar11) {
      dVar9 = dVar11;
    }
    *max_con_residual = dVar9;
    *sum_con_residuals = *sum_con_residuals + dVar11;
    lVar8 = lVar8 + 1;
    pdVar6 = pdVar6 + 2;
  } while( true );
}

Assistant:

void assessQpPrimalFeasibility(
    const Instance& instance, const double primal_feasibility_tolerance,
    const std::vector<double>& var_value, const std::vector<double>& con_value,
    HighsInt& num_var_infeasibilities, double& max_var_infeasibility,
    double& sum_var_infeasibilities, HighsInt& num_con_infeasibilities,
    double& max_con_infeasibility, double& sum_con_infeasibilities,
    double& max_con_residual, double& sum_con_residuals) {
  num_var_infeasibilities = 0;
  max_var_infeasibility = 0;
  sum_var_infeasibilities = 0;
  num_con_infeasibilities = 0;
  max_con_infeasibility = 0;
  sum_con_infeasibilities = 0;
  max_con_residual = 0;
  sum_con_residuals = 0;
  // Valid solution, but is it feasible?
  std::vector<HighsCDouble> con_value_quad;
  con_value_quad.assign(instance.num_con, HighsCDouble{0.0});
  for (HighsInt iVar = 0; iVar < instance.num_var; iVar++) {
    double lower = instance.var_lo[iVar];
    double upper = instance.var_up[iVar];
    double primal = var_value[iVar];
    double var_infeasibility = 0;
    if (primal < lower - primal_feasibility_tolerance) {
      var_infeasibility = lower - primal;
    } else if (primal > upper + primal_feasibility_tolerance) {
      var_infeasibility = primal - upper;
    }
    if (var_infeasibility > 0) {
      if (var_infeasibility > primal_feasibility_tolerance)
        num_var_infeasibilities++;
      max_var_infeasibility =
          std::max(var_infeasibility, max_var_infeasibility);
      sum_var_infeasibilities += var_infeasibility;
    }
    for (HighsInt iEl = instance.A.mat.start[iVar];
         iEl < instance.A.mat.start[iVar + 1]; iEl++) {
      con_value_quad[instance.A.mat.index[iEl]] +=
          primal * instance.A.mat.value[iEl];
    }
  }
  for (HighsInt iCon = 0; iCon < instance.num_con; iCon++) {
    double lower = instance.con_lo[iCon];
    double upper = instance.con_up[iCon];
    double primal = con_value[iCon];
    double con_infeasibility = 0;
    if (primal < lower - primal_feasibility_tolerance) {
      con_infeasibility = lower - primal;
    } else if (primal > upper + primal_feasibility_tolerance) {
      con_infeasibility = primal - upper;
    }
    if (con_infeasibility > 0) {
      if (con_infeasibility > primal_feasibility_tolerance)
        num_con_infeasibilities++;
      max_con_infeasibility =
          std::max(con_infeasibility, max_con_infeasibility);
      sum_con_infeasibilities += con_infeasibility;
    }
    double con_residual = std::fabs(primal - double(con_value_quad[iCon]));
    max_con_residual = std::max(con_residual, max_con_residual);
    sum_con_residuals += con_residual;
  }
}